

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

BindInfo *
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileGetBindInfo
          (BindInfo *__return_storage_ptr__,optional_ptr<duckdb::FunctionData,_true> bind_data_p)

{
  bool bVar1;
  FunctionData *pFVar2;
  MultiFileList *this;
  OpenFileInfo *__args;
  type bind_data_p_00;
  MultiFileListIterationHelper local_130;
  vector<duckdb::Value,_true> file_path;
  vector<duckdb::Value,_true> local_108;
  MultiFileListIterator __end2;
  MultiFileListIterator __begin2;
  optional_ptr<duckdb::FunctionData,_true> bind_data_p_local;
  Value local_68;
  
  (__return_storage_ptr__->options)._M_h._M_buckets =
       &(__return_storage_ptr__->options)._M_h._M_single_bucket;
  (__return_storage_ptr__->options)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->options)._M_h._M_element_count = 0;
  (__return_storage_ptr__->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __return_storage_ptr__->type = EXTERNAL;
  (__return_storage_ptr__->table).ptr = (TableCatalogEntry *)0x0;
  bind_data_p_local = bind_data_p;
  pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&bind_data_p_local);
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = shared_ptr<duckdb::MultiFileList,_true>::operator->
                   ((shared_ptr<duckdb::MultiFileList,_true> *)(pFVar2 + 5));
  local_130 = MultiFileList::Files(this);
  MultiFileListIterationHelper::begin(&__begin2,&local_130);
  MultiFileListIterationHelper::end(&__end2,&local_130);
  while( true ) {
    bVar1 = MultiFileListIterationHelper::MultiFileListIterator::operator!=(&__begin2,&__end2);
    if (!bVar1) break;
    __args = MultiFileListIterationHelper::MultiFileListIterator::operator*(&__begin2);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&file_path,&__args->path);
    MultiFileListIterationHelper::MultiFileListIterator::operator++(&__begin2);
  }
  OpenFileInfo::~OpenFileInfo(&__end2.current_file);
  OpenFileInfo::~OpenFileInfo(&__begin2.current_file);
  ::std::__cxx11::string::string((string *)&__begin2,"file_path",(allocator *)&local_130);
  LogicalType::LogicalType((LogicalType *)&__end2,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_108,
             &file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  Value::LIST(&local_68,(LogicalType *)&__end2,&local_108);
  BindInfo::InsertOption(__return_storage_ptr__,(string *)&__begin2,&local_68);
  Value::~Value(&local_68);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_108);
  LogicalType::~LogicalType((LogicalType *)&__end2);
  ::std::__cxx11::string::~string((string *)&__begin2);
  bind_data_p_00 =
       unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>::
       operator*((unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
                  *)(pFVar2 + 4));
  ParquetMultiFileInfo::GetBindInfo(bind_data_p_00,__return_storage_ptr__);
  MultiFileOptions::AddBatchInfo((MultiFileOptions *)(pFVar2 + 0x13),__return_storage_ptr__);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&file_path);
  return __return_storage_ptr__;
}

Assistant:

static BindInfo MultiFileGetBindInfo(const optional_ptr<FunctionData> bind_data_p) {
		BindInfo bind_info(ScanType::EXTERNAL);
		auto &bind_data = bind_data_p->Cast<MultiFileBindData>();

		vector<Value> file_path;
		for (const auto &file : bind_data.file_list->Files()) {
			file_path.emplace_back(file.path);
		}

		// LCOV_EXCL_START
		bind_info.InsertOption("file_path", Value::LIST(LogicalType::VARCHAR, file_path));
		OP::GetBindInfo(*bind_data.bind_data, bind_info);
		bind_data.file_options.AddBatchInfo(bind_info);
		// LCOV_EXCL_STOP
		return bind_info;
	}